

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

void util::ConstevalFormatString<0U>::Detail_CheckNumFormatSpecifiers(string_view str)

{
  long lVar1;
  bool bVar2;
  const_iterator pvVar3;
  char *pcVar4;
  undefined8 *puVar5;
  uint *puVar6;
  long in_FS_OFFSET;
  uint count;
  const_iterator it;
  uint count_normal;
  uint maybe_num;
  uint count_pos;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  uint *in_stack_ffffffffffffff80;
  char *local_30;
  int local_24;
  int local_20;
  uint local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = 0;
  local_1c = 0;
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::begin(in_stack_ffffffffffffff78)
  ;
LAB_00c037a5:
  do {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end(in_stack_ffffffffffffff78);
    if (pvVar3 <= local_30) {
      if ((local_24 == 0) || (local_1c == 0)) {
        if (local_24 == 0 && local_1c == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            return;
          }
        }
        else {
          puVar5 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar5 = "Format specifier count must match the argument count!";
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(puVar5,&char_const*::typeinfo,0);
          }
        }
      }
      else {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = "Format specifiers must be all positional or all non-positional!";
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(puVar5,&char_const*::typeinfo,0);
        }
      }
LAB_00c03ac2:
      __stack_chk_fail();
    }
    if (*local_30 == '%') {
      pcVar4 = local_30 + 1;
      pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end(in_stack_ffffffffffffff78)
      ;
      if (pvVar3 <= pcVar4) {
        puVar5 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar5 = "Format specifier incorrectly terminated by end of string";
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(puVar5,&char_const*::typeinfo,0);
        }
        goto LAB_00c03ac2;
      }
      if (*pcVar4 == '%') {
        local_30 = local_30 + 2;
      }
      else {
        local_20 = 0;
        local_30 = pcVar4;
        while( true ) {
          bVar2 = false;
          if ('/' < *local_30) {
            bVar2 = *local_30 < ':';
          }
          if (!bVar2) break;
          local_20 = *local_30 + -0x30 + local_20 * 10;
          local_30 = local_30 + 1;
        }
        if (*local_30 == '$') {
          if (local_20 == 0) {
            puVar5 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar5 = "Positional format specifier must have position of at least 1";
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(puVar5,&char_const*::typeinfo,0);
            }
            goto LAB_00c03ac2;
          }
          puVar6 = std::max<unsigned_int>
                             (in_stack_ffffffffffffff80,(uint *)in_stack_ffffffffffffff78);
          local_1c = *puVar6;
          pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::end
                             (in_stack_ffffffffffffff78);
          if (pvVar3 <= local_30 + 1) {
            puVar5 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar5 = "Format specifier incorrectly terminated by end of string";
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(puVar5,&char_const*::typeinfo,0);
            }
            goto LAB_00c03ac2;
          }
        }
        else {
          local_24 = local_24 + 1;
        }
        local_30 = local_30 + 1;
      }
      goto LAB_00c037a5;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

constexpr static void Detail_CheckNumFormatSpecifiers(std::string_view str)
    {
        unsigned count_normal{0}; // Number of "normal" specifiers, like %s
        unsigned count_pos{0};    // Max number in positional specifier, like %8$s
        for (auto it{str.begin()}; it < str.end();) {
            if (*it != '%') {
                ++it;
                continue;
            }

            if (++it >= str.end()) throw "Format specifier incorrectly terminated by end of string";
            if (*it == '%') {
                // Percent escape: %%
                ++it;
                continue;
            }

            unsigned maybe_num{0};
            while ('0' <= *it && *it <= '9') {
                maybe_num *= 10;
                maybe_num += *it - '0';
                ++it;
            };

            if (*it == '$') {
                // Positional specifier, like %8$s
                if (maybe_num == 0) throw "Positional format specifier must have position of at least 1";
                count_pos = std::max(count_pos, maybe_num);
                if (++it >= str.end()) throw "Format specifier incorrectly terminated by end of string";
            } else {
                // Non-positional specifier, like %s
                ++count_normal;
                ++it;
            }
            // The remainder "[flags][width][.precision][length]type" of the
            // specifier is not checked. Parsing continues with the next '%'.
        }
        if (count_normal && count_pos) throw "Format specifiers must be all positional or all non-positional!";
        unsigned count{count_normal | count_pos};
        if (num_params != count) throw "Format specifier count must match the argument count!";
    }